

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  BYTE *pInLimit;
  uint uVar1;
  uint uVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  U32 offsetCode;
  uint uVar11;
  int *piVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  int *ip;
  int *piVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  bool bVar20;
  uint local_bc;
  ulong local_a8;
  
  pInLimit = (BYTE *)((long)src + srcSize);
  pBVar13 = (ms->window).base + (ms->window).dictLimit;
  uVar1 = *rep;
  uVar2 = rep[1];
  ip = (int *)((ulong)(pBVar13 == (BYTE *)src) + (long)src);
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar6 = (int)ip - (int)pBVar13;
  local_bc = uVar2;
  if (uVar6 < uVar2) {
    local_bc = 0;
  }
  uVar17 = (ulong)uVar1;
  if (uVar6 < uVar1) {
    uVar17 = 0;
  }
  piVar12 = (int *)((long)src + (srcSize - 8));
  do {
    uVar16 = (uint)uVar17;
    while( true ) {
      if (piVar12 <= ip) {
        uVar9 = 0;
        if (uVar6 < uVar2) {
          uVar9 = uVar2;
        }
        if (uVar6 < uVar1) {
          uVar9 = uVar1;
        }
        if (uVar16 == 0) {
          uVar16 = uVar9;
        }
        if (local_bc != 0) {
          uVar9 = local_bc;
        }
        *rep = uVar16;
        rep[1] = uVar9;
        return (long)pInLimit - (long)src;
      }
      if ((uVar16 != 0) && (*(int *)((long)ip + 1) == *(int *)((long)ip + -uVar17 + 1))) {
        piVar15 = (int *)((long)ip + 1);
        sVar10 = ZSTD_count((BYTE *)((long)ip + 5),(BYTE *)((long)ip + -uVar17 + 5),pInLimit);
        uVar18 = sVar10 + 4;
        offsetCode = 0;
        goto LAB_00153d57;
      }
      iVar19 = (int)ip;
      if (cParams->searchLength - 6 < 2) {
        uVar7 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar11 = iVar19 - (int)pBVar4;
        uVar5 = uVar11 - uVar7;
        if (uVar11 < uVar7) {
          uVar5 = 0;
        }
        iVar19 = 1 << ((byte)cParams->searchLog & 0x1f);
        uVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
        local_a8 = 99999999;
        uVar18 = 3;
        while( true ) {
          bVar20 = iVar19 == 0;
          iVar19 = iVar19 + -1;
          if ((((uVar8 <= uVar9) || (bVar20)) ||
              ((pBVar14 = pBVar4 + uVar8, pBVar14[uVar18] == *(BYTE *)((long)ip + uVar18) &&
               ((sVar10 = ZSTD_count((BYTE *)ip,pBVar14,pInLimit), uVar18 < sVar10 &&
                (local_a8 = (ulong)((uVar11 + 2) - uVar8), uVar18 = sVar10,
                (BYTE *)(sVar10 + (long)ip) == pInLimit)))))) || (uVar8 <= uVar5)) break;
          uVar8 = pUVar3[uVar8 & uVar7 - 1];
        }
      }
      else if (cParams->searchLength == 5) {
        uVar7 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar11 = iVar19 - (int)pBVar4;
        uVar5 = uVar11 - uVar7;
        if (uVar11 < uVar7) {
          uVar5 = 0;
        }
        iVar19 = 1 << ((byte)cParams->searchLog & 0x1f);
        uVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
        local_a8 = 99999999;
        uVar18 = 3;
        while( true ) {
          bVar20 = iVar19 == 0;
          iVar19 = iVar19 + -1;
          if ((((uVar8 <= uVar9) || (bVar20)) ||
              ((pBVar14 = pBVar4 + uVar8, pBVar14[uVar18] == *(BYTE *)((long)ip + uVar18) &&
               ((sVar10 = ZSTD_count((BYTE *)ip,pBVar14,pInLimit), uVar18 < sVar10 &&
                (local_a8 = (ulong)((uVar11 + 2) - uVar8), uVar18 = sVar10,
                (BYTE *)(sVar10 + (long)ip) == pInLimit)))))) || (uVar8 <= uVar5)) break;
          uVar8 = pUVar3[uVar8 & uVar7 - 1];
        }
      }
      else {
        uVar7 = 1 << ((byte)cParams->chainLog & 0x1f);
        pUVar3 = ms->chainTable;
        pBVar4 = (ms->window).base;
        uVar9 = (ms->window).lowLimit;
        uVar11 = iVar19 - (int)pBVar4;
        uVar5 = uVar11 - uVar7;
        if (uVar11 < uVar7) {
          uVar5 = 0;
        }
        iVar19 = 1 << ((byte)cParams->searchLog & 0x1f);
        uVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
        local_a8 = 99999999;
        uVar18 = 3;
        while( true ) {
          bVar20 = iVar19 == 0;
          iVar19 = iVar19 + -1;
          if (((uVar8 <= uVar9) || (bVar20)) ||
             (((pBVar14 = pBVar4 + uVar8, pBVar14[uVar18] == *(BYTE *)((long)ip + uVar18) &&
               ((sVar10 = ZSTD_count((BYTE *)ip,pBVar14,pInLimit), uVar18 < sVar10 &&
                (local_a8 = (ulong)((uVar11 + 2) - uVar8), uVar18 = sVar10,
                (BYTE *)(sVar10 + (long)ip) == pInLimit)))) || (uVar8 <= uVar5)))) break;
          uVar8 = pUVar3[uVar8 & uVar7 - 1];
        }
      }
      if (3 < uVar18) break;
      ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
    }
    if (local_a8 == 0) {
      offsetCode = 0;
      piVar15 = ip;
    }
    else {
      for (; ((src < ip && (pBVar13 < (BYTE *)((long)ip + (2 - local_a8)))) &&
             (*(char *)((long)ip + -1) == *(char *)((long)ip + (1 - local_a8))));
          ip = (int *)((long)ip + -1)) {
        uVar18 = uVar18 + 1;
      }
      offsetCode = (U32)local_a8;
      uVar17 = (ulong)(offsetCode - 2);
      piVar15 = ip;
      local_bc = uVar16;
    }
LAB_00153d57:
    ZSTD_storeSeq(seqStore,(long)piVar15 - (long)src,src,offsetCode,uVar18 - 3);
    for (ip = (int *)((long)piVar15 + uVar18);
        ((src = ip, local_bc != 0 && (ip <= piVar12)) &&
        (*ip == *(int *)((long)ip - (ulong)local_bc))); ip = (int *)((long)ip + sVar10 + 4)) {
      sVar10 = ZSTD_count((BYTE *)(ip + 1),(BYTE *)((long)ip + (4 - (ulong)local_bc)),pInLimit);
      ZSTD_storeSeq(seqStore,0,ip,0,sVar10 + 1);
      uVar18 = (ulong)local_bc;
      local_bc = (uint)uVar17;
      uVar17 = uVar18;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 0);
}